

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O2

void __thiscall DSDcc::DSDdPMR::processSuperFrame(DSDdPMR *this)

{
  int iVar1;
  int iVar2;
  uint symbolIndex;
  double __x;
  
  iVar1 = DSDSymbol::getDibit(&this->m_dsdDecoder->m_dsdSymbol);
  symbolIndex = this->m_symbolIndex;
  if (symbolIndex == 0) {
    this->m_frameType = DPMRPayloadFrame;
    this->m_frameIndex = 0;
    DSDLogger::log(&this->m_dsdDecoder->m_dsdLogger,__x);
    symbolIndex = this->m_symbolIndex;
  }
  if ((int)symbolIndex < 0x24) {
    this->m_calledIdHalf = false;
    this->m_ownIdHalf = false;
  }
  else {
    if (symbolIndex < 0xb4) {
      iVar2 = symbolIndex - 0x24;
LAB_0011ada6:
      processTCH(this,iVar2,iVar1);
      goto LAB_0011adca;
    }
    if (symbolIndex < 0xc0) {
      iVar2 = symbolIndex - 0xb4;
LAB_0011adc0:
      processColourCode(this,iVar2,iVar1);
      goto LAB_0011adca;
    }
    if (symbolIndex < 0xe4) {
      symbolIndex = symbolIndex - 0xc0;
    }
    else {
      if (symbolIndex < 0x174) {
        iVar2 = symbolIndex - 0xe4;
        goto LAB_0011ada6;
      }
      if (symbolIndex < 0x180) {
        processFS2(this,symbolIndex - 0x174,iVar1);
        goto LAB_0011adca;
      }
      if (symbolIndex < 0x1a4) {
        symbolIndex = symbolIndex - 0x180;
      }
      else {
        if (symbolIndex < 0x234) {
          iVar2 = symbolIndex - 0x1a4;
          goto LAB_0011ada6;
        }
        if (symbolIndex < 0x240) {
          iVar2 = symbolIndex - 0x234;
          goto LAB_0011adc0;
        }
        if (0x263 < symbolIndex) {
          if (0x2f3 < symbolIndex) {
            this->m_frameType = DPMRNoFrame;
            DSDDecoder::resetFrameSync(this->m_dsdDecoder);
            return;
          }
          processTCH(this,symbolIndex - 0x264,iVar1);
          iVar1 = this->m_symbolIndex + 1;
          this->m_symbolIndex = iVar1;
          if (iVar1 != 0x2f4) {
            return;
          }
          this->m_state = DPMRPostFrame;
          this->m_frameType = DPMRNoFrame;
          this->m_symbolIndex = 0;
          return;
        }
        symbolIndex = symbolIndex - 0x240;
      }
    }
  }
  processCCH(this,symbolIndex,iVar1);
LAB_0011adca:
  this->m_symbolIndex = this->m_symbolIndex + 1;
  return;
}

Assistant:

void DSDdPMR::processSuperFrame()
{
    int dibit = m_dsdDecoder->m_dsdSymbol.getDibit(); // get di-bit from symbol

    if (m_symbolIndex == 0) // new frame
    {
        m_frameType = DPMRPayloadFrame;
        m_frameIndex = 0;
        m_dsdDecoder->getLogger().log("DSDdPMR::processSuperFrame: start\n"); // DEBUG
    }

    if (m_symbolIndex < 36) // Start of frame 0 - CCH0
    {
        m_calledIdHalf = false;
        m_ownIdHalf = false;
        processCCH(m_symbolIndex, dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144) // TCH0
    {
        processTCH(m_symbolIndex - 36, dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12) // Start of frame 1 - CC0
    {
        processColourCode(m_symbolIndex - (36 + 144), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36) // CCH1
    {
        processCCH(m_symbolIndex - (36 + 144 + 12), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144) // TCH1
    {
        processTCH(m_symbolIndex - (36 + 144 + 12 + 36), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12) // Start of frame 2 - FS2-1
    {
        processFS2(m_symbolIndex - (36 + 144 + 12 + 36 + 144), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36) // CCH2
    {
        processCCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144) // TCH2
    {
        processTCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12) // Start of frame 3 - CC1
    {
        processColourCode(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36 + 144), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36) // CCH3
    {
        processCCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12), dibit);
        m_symbolIndex++;
    }
    else if (m_symbolIndex < 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144) // TCH3
    {
        processTCH(m_symbolIndex - (36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36), dibit);
        m_symbolIndex++;

        if (m_symbolIndex == 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144 + 12 + 36 + 144) // end of super frame
        {
            m_frameType = DPMRNoFrame; // look for continuation or end
            m_state = DPMRPostFrame;
            m_symbolIndex = 0;
        }
    }
    else // shouldn´t go there => out of sync error
    {
    	m_frameType = DPMRNoFrame;
        m_dsdDecoder->resetFrameSync(); // end
    }
}